

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestBranchNoName::Run(TestBranchNoName *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Results rs;
  TestBranchInternal2 myTestA;
  ostringstream oss;
  Results local_208;
  string local_1f0;
  Test local_1d0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0)
  ;
  std::__cxx11::string::string((string *)&local_1f0,"A",(allocator *)&local_208);
  TestBranchInternal2::TestBranchInternal2((TestBranchInternal2 *)&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  local_1f0._M_dataplus._M_p = (pointer)0x0;
  local_1f0._M_string_length = 100;
  local_1f0.field_2._M_allocated_capacity = 0;
  testinator::RunAllTests(&local_208,(RunParams *)&local_1f0,(Outputter *)local_1d0._vptr_Test);
  if (Run()::expected_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&Run()::expected_abi_cxx11_,"main.cpp:448",(allocator *)&local_1f0);
      __cxa_atexit(std::__cxx11::string::~string,&Run()::expected_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Run()::expected_abi_cxx11_);
    }
  }
  if ((local_208.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
       .super__Vector_impl_data._M_start ==
       local_208.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
       .super__Vector_impl_data._M_finish) ||
     ((local_208.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>._M_impl
       .super__Vector_impl_data._M_start)->m_success != true)) {
    bVar3 = false;
  }
  else {
    std::__cxx11::stringbuf::str();
    lVar2 = std::__cxx11::string::find((string *)&local_1f0,0x17ba58);
    bVar3 = lVar2 != -1;
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&local_208);
  testinator::Test::~Test(&local_1d0);
  if ((Outputter *)local_1d0._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1d0._vptr_Test)[8])(local_1d0._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return bVar3;
}

Assistant:

virtual bool Run()
  {
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);
    TestBranchInternal2 myTestA("A");
    testinator::Results rs = testinator::RunAllTests(testinator::RunParams(), op.get());

    static string expected = "main.cpp:448";
    return !rs.empty() && rs.front().m_success
      && oss.str().find(expected) != string::npos;
  }